

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::LoadRepositories(cmCTestSVN *this)

{
  size_t *psVar1;
  bool bVar2;
  iterator __tmp;
  _Node *p_Var3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  svn_status;
  OutputLogger err;
  ExternalParser out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  OutputLogger local_2d0;
  ExternalParser local_290;
  
  bVar2 = true;
  if ((this->Repositories).
      super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&this->Repositories) {
    p_Var3 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::
             _M_create_node<>(&this->Repositories);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->Repositories).
              super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->RootInfo =
         (SVNInfo *)
         ((this->Repositories).
          super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
          _M_node.super__List_node_base._M_prev + 1);
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2e8,
               (char (*) [7])0x890d94);
    ExternalParser::ExternalParser(&local_290,this,"external-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_2d0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"external-err> ");
    bVar2 = RunSVNCommand(this,&local_2e8,(OutputParser *)&local_290,(OutputParser *)&local_2d0);
    local_2d0.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_00b36268;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.super_LineParser.Line._M_dataplus._M_p !=
        &local_2d0.super_LineParser.Line.field_2) {
      operator_delete(local_2d0.super_LineParser.Line._M_dataplus._M_p,
                      local_2d0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_290.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__ExternalParser_00b32540;
    if (local_290.RegexExternal.program != (char *)0x0) {
      operator_delete__(local_290.RegexExternal.program);
    }
    local_290.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_00b36268;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.super_LineParser.Line._M_dataplus._M_p !=
        &local_290.super_LineParser.Line.field_2) {
      operator_delete(local_290.super_LineParser.Line._M_dataplus._M_p,
                      local_290.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e8);
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::LoadRepositories()
{
  if (!this->Repositories.empty()) {
    return true;
  }

  // Info for root repository
  this->Repositories.emplace_back();
  this->RootInfo = &(this->Repositories.back());

  // Run "svn status" to get the list of external repositories
  std::vector<std::string> svn_status;
  svn_status.emplace_back("status");
  ExternalParser out(this, "external-out> ");
  OutputLogger err(this->Log, "external-err> ");
  return this->RunSVNCommand(svn_status, &out, &err);
}